

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::FormatStrSS<std::__cxx11::stringstream,char[32],std::__cxx11::string,char>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [32],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs,
               char *RestArgs_1)

{
  undefined8 in_RAX;
  size_t sVar1;
  ostream *poVar2;
  undefined8 uStack_28;
  
  poVar2 = (ostream *)(ss + 0x10);
  uStack_28 = in_RAX;
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,*FirstArg,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(RestArgs->_M_dataplus)._M_p,RestArgs->_M_string_length);
  uStack_28 = CONCAT17(*RestArgs_1,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}